

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O2

bool __thiscall Am_Data_Locator::Find_File(Am_Data_Locator *this,Am_Filename *f,Am_Filename *found)

{
  bool bVar1;
  _List_node_base *p_Var2;
  Am_Filename fullname;
  Am_Filename AStack_48;
  
  p_Var2 = (_List_node_base *)this;
  if ((((f->filename)._M_string_length == 0) || (*(f->filename)._M_dataplus._M_p == '/')) &&
     (bVar1 = Am_Filename::Exists(f), bVar1)) {
    std::__cxx11::string::_M_assign((string *)found);
  }
  else {
    while( true ) {
      p_Var2 = (((dir_list_t *)&p_Var2->_M_next)->
               super__List_base<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var2 == (_List_node_base *)this) {
        return false;
      }
      Am_Filename::Am_Filename(&AStack_48,(Am_Filename *)(p_Var2 + 1),f);
      bVar1 = Am_Filename::Exists(&AStack_48);
      if (bVar1) break;
      std::__cxx11::string::~string((string *)&AStack_48);
    }
    std::__cxx11::string::_M_assign((string *)found);
    std::__cxx11::string::~string((string *)&AStack_48);
  }
  return true;
}

Assistant:

bool
Am_Data_Locator::Find_File(const Am_Filename &f, Am_Filename &found) const
{
  if (!(f.Is_Relative()) && f.Exists()) // Checks the filename itself
  {
    found = f;
    return true;
  } else // Try to complete the name with some search directory
  {
    for (dir_list_t::const_iterator it = search_list.begin();
         it != search_list.end(); ++it) {
      const Am_Filename fullname((*it).first, f);
      if (fullname.Exists()) {
        found = fullname;
        return true;
      }
    }
  }
  return false;
}